

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App * __thiscall
CLI::App::_find_subcommand(App *this,string *subc_name,bool ignore_disabled,bool ignore_used)

{
  pointer psVar1;
  bool bVar2;
  App *pAVar3;
  pointer psVar4;
  string local_50;
  
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar4 == psVar1) {
      return (App *)0x0;
    }
    pAVar3 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((pAVar3->disabled_ & ignore_disabled) == 0) {
      if ((pAVar3->name_)._M_string_length == 0) {
        pAVar3 = _find_subcommand(pAVar3,subc_name,ignore_disabled,ignore_used);
        if (pAVar3 != (App *)0x0) {
          return pAVar3;
        }
        pAVar3 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      ::std::__cxx11::string::string((string *)&local_50,(string *)subc_name);
      bVar2 = check_name(pAVar3,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        pAVar3 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (pAVar3->parsed_ == 0) {
          return pAVar3;
        }
        if (!ignore_used) {
          return pAVar3;
        }
      }
    }
    psVar4 = psVar4 + 1;
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE App *
App::_find_subcommand(const std::string &subc_name, bool ignore_disabled, bool ignore_used) const noexcept {
    for(const App_p &com : subcommands_) {
        if(com->disabled_ && ignore_disabled)
            continue;
        if(com->get_name().empty()) {
            auto *subc = com->_find_subcommand(subc_name, ignore_disabled, ignore_used);
            if(subc != nullptr) {
                return subc;
            }
        }
        if(com->check_name(subc_name)) {
            if((!*com) || !ignore_used)
                return com.get();
        }
    }
    return nullptr;
}